

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

void __thiscall
cmLocalGenerator::OutputLinkLibraries
          (cmLocalGenerator *this,cmComputeLinkInformation *pcli,
          cmLinkLineComputer *linkLineComputer,string *linkLibraries,string *frameworkPath,
          string *linkPath)

{
  cmMakefile *pcVar1;
  char *pcVar2;
  string *psVar3;
  string local_2e8 [32];
  string local_2c8;
  string local_2a8;
  undefined1 local_288 [8];
  string fwSearchFlag;
  undefined1 local_260 [8];
  string fwSearchFlagVar;
  char *stdLibs;
  string stdLibString;
  allocator<char> local_1f1;
  undefined1 local_1f0 [8];
  string standardLibsVar;
  string local_1c8;
  string local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  char *local_148;
  char *value_1;
  string libPathTerminator;
  string local_118;
  string local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  char *local_88;
  char *value;
  string libPathFlag;
  string linkLanguage;
  cmComputeLinkInformation *cli;
  string *linkPath_local;
  string *frameworkPath_local;
  string *linkLibraries_local;
  cmLinkLineComputer *linkLineComputer_local;
  cmComputeLinkInformation *pcli_local;
  cmLocalGenerator *this_local;
  
  cmComputeLinkInformation::GetLinkLanguage_abi_cxx11_
            ((string *)((long)&libPathFlag.field_2 + 8),pcli);
  std::__cxx11::string::string((string *)&value);
  pcVar1 = this->Makefile;
  cmComputeLinkInformation::GetLinkLanguage_abi_cxx11_(&local_e8,pcli);
  std::operator+(&local_c8,"CMAKE_",&local_e8);
  std::operator+(&local_a8,&local_c8,"_LIBRARY_PATH_FLAG");
  pcVar2 = cmMakefile::GetDefinition(pcVar1,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  local_88 = pcVar2;
  if (pcVar2 == (char *)0x0) {
    pcVar1 = this->Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_118,"CMAKE_LIBRARY_PATH_FLAG",
               (allocator<char> *)(libPathTerminator.field_2._M_local_buf + 0xf));
    psVar3 = cmMakefile::GetRequiredDefinition(pcVar1,&local_118);
    std::__cxx11::string::operator=((string *)&value,(string *)psVar3);
    std::__cxx11::string::~string((string *)&local_118);
    std::allocator<char>::~allocator
              ((allocator<char> *)(libPathTerminator.field_2._M_local_buf + 0xf));
  }
  else {
    std::__cxx11::string::operator=((string *)&value,pcVar2);
  }
  std::__cxx11::string::string((string *)&value_1);
  pcVar1 = this->Makefile;
  cmComputeLinkInformation::GetLinkLanguage_abi_cxx11_(&local_1a8,pcli);
  std::operator+(&local_188,"CMAKE_",&local_1a8);
  std::operator+(&local_168,&local_188,"_LIBRARY_PATH_TERMINATOR");
  pcVar2 = cmMakefile::GetDefinition(pcVar1,&local_168);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string((string *)&local_1a8);
  local_148 = pcVar2;
  if (pcVar2 == (char *)0x0) {
    pcVar1 = this->Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c8,"CMAKE_LIBRARY_PATH_TERMINATOR",
               (allocator<char> *)(standardLibsVar.field_2._M_local_buf + 0xf));
    psVar3 = cmMakefile::GetRequiredDefinition(pcVar1,&local_1c8);
    std::__cxx11::string::operator=((string *)&value_1,(string *)psVar3);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::allocator<char>::~allocator
              ((allocator<char> *)(standardLibsVar.field_2._M_local_buf + 0xf));
  }
  else {
    std::__cxx11::string::operator=((string *)&value_1,pcVar2);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_1f0,"CMAKE_",&local_1f1);
  std::allocator<char>::~allocator(&local_1f1);
  cmComputeLinkInformation::GetLinkLanguage_abi_cxx11_
            ((string *)((long)&stdLibString.field_2 + 8),pcli);
  std::__cxx11::string::operator+=
            ((string *)local_1f0,(string *)(stdLibString.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(stdLibString.field_2._M_local_buf + 8));
  std::__cxx11::string::operator+=((string *)local_1f0,"_STANDARD_LIBRARIES");
  std::__cxx11::string::string((string *)&stdLibs);
  fwSearchFlagVar.field_2._8_8_ = cmMakefile::GetDefinition(this->Makefile,(string *)local_1f0);
  if ((char *)fwSearchFlagVar.field_2._8_8_ != (char *)0x0) {
    std::__cxx11::string::operator=((string *)&stdLibs,(char *)fwSearchFlagVar.field_2._8_8_);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_260,"CMAKE_",
             (allocator<char> *)(fwSearchFlag.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(fwSearchFlag.field_2._M_local_buf + 0xf));
  std::__cxx11::string::operator+=
            ((string *)local_260,(string *)(libPathFlag.field_2._M_local_buf + 8));
  std::__cxx11::string::operator+=((string *)local_260,"_FRAMEWORK_SEARCH_FLAG");
  psVar3 = cmMakefile::GetSafeDefinition(this->Makefile,(string *)local_260);
  std::__cxx11::string::string((string *)local_288,(string *)psVar3);
  cmLinkLineComputer::ComputeFrameworkPath(&local_2a8,linkLineComputer,pcli,(string *)local_288);
  std::__cxx11::string::operator=((string *)frameworkPath,(string *)&local_2a8);
  std::__cxx11::string::~string((string *)&local_2a8);
  cmLinkLineComputer::ComputeLinkPath
            (&local_2c8,linkLineComputer,pcli,(string *)&value,(string *)&value_1);
  std::__cxx11::string::operator=((string *)linkPath,(string *)&local_2c8);
  std::__cxx11::string::~string((string *)&local_2c8);
  (*linkLineComputer->_vptr_cmLinkLineComputer[3])(local_2e8,linkLineComputer,pcli,&stdLibs);
  std::__cxx11::string::operator=((string *)linkLibraries,local_2e8);
  std::__cxx11::string::~string(local_2e8);
  std::__cxx11::string::~string((string *)local_288);
  std::__cxx11::string::~string((string *)local_260);
  std::__cxx11::string::~string((string *)&stdLibs);
  std::__cxx11::string::~string((string *)local_1f0);
  std::__cxx11::string::~string((string *)&value_1);
  std::__cxx11::string::~string((string *)&value);
  std::__cxx11::string::~string((string *)(libPathFlag.field_2._M_local_buf + 8));
  return;
}

Assistant:

void cmLocalGenerator::OutputLinkLibraries(
  cmComputeLinkInformation* pcli, cmLinkLineComputer* linkLineComputer,
  std::string& linkLibraries, std::string& frameworkPath,
  std::string& linkPath)
{
  cmComputeLinkInformation& cli = *pcli;

  std::string linkLanguage = cli.GetLinkLanguage();

  std::string libPathFlag;
  if (const char* value = this->Makefile->GetDefinition(
        "CMAKE_" + cli.GetLinkLanguage() + "_LIBRARY_PATH_FLAG")) {
    libPathFlag = value;
  } else {
    libPathFlag =
      this->Makefile->GetRequiredDefinition("CMAKE_LIBRARY_PATH_FLAG");
  }

  std::string libPathTerminator;
  if (const char* value = this->Makefile->GetDefinition(
        "CMAKE_" + cli.GetLinkLanguage() + "_LIBRARY_PATH_TERMINATOR")) {
    libPathTerminator = value;
  } else {
    libPathTerminator =
      this->Makefile->GetRequiredDefinition("CMAKE_LIBRARY_PATH_TERMINATOR");
  }

  // Add standard libraries for this language.
  std::string standardLibsVar = "CMAKE_";
  standardLibsVar += cli.GetLinkLanguage();
  standardLibsVar += "_STANDARD_LIBRARIES";
  std::string stdLibString;
  if (const char* stdLibs = this->Makefile->GetDefinition(standardLibsVar)) {
    stdLibString = stdLibs;
  }

  // Append the framework search path flags.
  std::string fwSearchFlagVar = "CMAKE_";
  fwSearchFlagVar += linkLanguage;
  fwSearchFlagVar += "_FRAMEWORK_SEARCH_FLAG";
  std::string fwSearchFlag =
    this->Makefile->GetSafeDefinition(fwSearchFlagVar);

  frameworkPath = linkLineComputer->ComputeFrameworkPath(cli, fwSearchFlag);
  linkPath =
    linkLineComputer->ComputeLinkPath(cli, libPathFlag, libPathTerminator);

  linkLibraries = linkLineComputer->ComputeLinkLibraries(cli, stdLibString);
}